

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O1

char * parse_identifier(char *src,rtosc_arg_val_t *arg,char *buffer_for_strings,size_t *bufsize)

{
  char cVar1;
  ushort **ppuVar2;
  
  cVar1 = *src;
  if (((long)cVar1 != 0x5f) &&
     (ppuVar2 = __ctype_b_loc(), (*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 4) == 0)) {
    return src;
  }
  arg->type = 'S';
  (arg->val).s = buffer_for_strings;
  while ((cVar1 = *src, (long)cVar1 == 0x5f ||
         (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[cVar1] & 8) != 0))) {
    *bufsize = *bufsize - 1;
    *buffer_for_strings = *src;
    buffer_for_strings = buffer_for_strings + 1;
    src = src + 1;
  }
  *bufsize = *bufsize - 1;
  *buffer_for_strings = '\0';
  return src;
}

Assistant:

const char* parse_identifier(const char* src, rtosc_arg_val_t *arg,
                             char* buffer_for_strings,
                             size_t* bufsize)
{
    if(*src == '_' || isalpha(*src))
    {
        arg->type = 'S';
        arg->val.s = buffer_for_strings;
        for(; *src == '_' || isalnum(*src); ++src)
        {
            assert(*bufsize);
            (*bufsize)--;
            *buffer_for_strings = *src;
            ++buffer_for_strings;
        }
        assert(*bufsize);
        (*bufsize)--;
        *buffer_for_strings = 0;
        ++buffer_for_strings;
    }
    return src;
}